

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

void __thiscall
flexbuffers::Reference::ToString
          (Reference *this,bool strings_quoted,bool keys_quoted,string *s,bool indented,
          int cur_indent,char *indent_string,bool natural_utf8)

{
  char c;
  Type TVar1;
  bool bVar2;
  int64_t t;
  uint64_t t_00;
  char *pcVar3;
  size_t length;
  uint8_t *data;
  long lVar4;
  bool keys_quoted_00;
  size_t i;
  ulong i_00;
  double t_01;
  TypedVector keys;
  Reference local_88;
  uint local_74;
  uint local_70;
  uint local_6c;
  ulong local_68;
  Vector vals;
  Map m;
  
  TVar1 = this->type_;
  switch(TVar1) {
  case FBT_NULL:
    break;
  case FBT_INT:
  case FBT_INDIRECT_INT:
    t = AsInt64(this);
    flatbuffers::NumToString<long>((string *)&keys,t);
    std::__cxx11::string::append((string *)s);
    goto LAB_00139eed;
  case FBT_UINT:
  case FBT_INDIRECT_UINT:
    t_00 = AsUInt64(this);
    flatbuffers::NumToString<unsigned_long>((string *)&keys,t_00);
    std::__cxx11::string::append((string *)s);
    goto LAB_00139eed;
  case FBT_FLOAT:
  case FBT_INDIRECT_FLOAT:
    t_01 = AsDouble(this);
    flatbuffers::NumToString<double>((string *)&keys,t_01);
    std::__cxx11::string::append((string *)s);
LAB_00139eed:
    std::__cxx11::string::~string((string *)&keys);
    return;
  case FBT_KEY:
    pcVar3 = AsKey(this);
    if (keys_quoted) {
      length = strlen(pcVar3);
      flatbuffers::EscapeString(pcVar3,length,s,true,natural_utf8);
      return;
    }
    break;
  case FBT_STRING:
    data = Indirect(this);
    Sized::Sized(&keys.super_Sized,data,this->byte_width_);
    if (!strings_quoted) {
      std::__cxx11::string::append((char *)s,(ulong)keys.super_Sized.super_Object.data_);
      return;
    }
LAB_0013a1cd:
    flatbuffers::EscapeString
              ((char *)keys.super_Sized.super_Object.data_,keys.super_Sized.size_,s,true,
               natural_utf8);
    return;
  case FBT_MAP:
    std::__cxx11::string::append((char *)s);
    std::__cxx11::string::append((char *)s);
    AsMap(&m,this);
    Map::Keys(&keys,&m);
    Map::Values(&vals,&m);
    i_00 = 0;
    local_6c = (uint)natural_utf8;
    local_74 = (uint)indented;
    local_70 = (uint)keys_quoted;
    local_68 = (ulong)(uint)cur_indent;
    do {
      if (keys.super_Sized.size_ <= i_00) {
        if (indented) {
          IndentString(s,(int)local_68,indent_string);
        }
        else {
          std::__cxx11::string::append((char *)s);
        }
        std::__cxx11::string::append((char *)s);
        return;
      }
      keys_quoted_00 = true;
      if (!keys_quoted) {
        local_88._8_8_ =
             (ulong)keys.super_Sized.super_Object.byte_width_ + ((ulong)keys.type_ << 0x20) + 0x100;
        local_88.data_ =
             keys.super_Sized.super_Object.data_ + i_00 * keys.super_Sized.super_Object.byte_width_;
        pcVar3 = AsKey(&local_88);
        if (((int)*pcVar3 == 0x5f) || (((int)*pcVar3 & 0xffffffdfU) - 0x41 < 0x1a)) {
          do {
            pcVar3 = pcVar3 + 1;
            c = *pcVar3;
            keys_quoted_00 = c != '\0';
            if (c == '\0') break;
            bVar2 = flatbuffers::is_alnum(c);
          } while ((bVar2) || (*pcVar3 == '_'));
        }
      }
      if (indented) {
        IndentString(s,cur_indent + 1,indent_string);
      }
      if (i_00 < keys.super_Sized.size_) {
        local_88.data_ =
             keys.super_Sized.super_Object.data_ + i_00 * keys.super_Sized.super_Object.byte_width_;
        lVar4 = (ulong)keys.super_Sized.super_Object.byte_width_ + ((ulong)keys.type_ << 0x20) +
                0x100;
      }
      else {
        lVar4 = 0x101;
        local_88.data_ = (uint8_t *)0x0;
      }
      local_88.parent_width_ = (char)lVar4;
      local_88.byte_width_ = (char)((ulong)lVar4 >> 8);
      local_88._10_2_ = (short)((ulong)lVar4 >> 0x10);
      local_88.type_ = (int)((ulong)lVar4 >> 0x20);
      ToString(&local_88,true,keys_quoted_00,s);
      std::__cxx11::string::append((char *)s);
      local_88 = Vector::operator[](&vals,i_00);
      ToString(&local_88,true,SUB41(local_70,0),s,SUB41(local_74,0),cur_indent + 1,indent_string,
               SUB41(local_6c,0));
      if (i_00 < keys.super_Sized.size_ - 1) {
        std::__cxx11::string::append((char *)s);
LAB_0013a0fc:
        std::__cxx11::string::append((char *)s);
      }
      else if (indented) goto LAB_0013a0fc;
      i_00 = i_00 + 1;
    } while( true );
  default:
    if (TVar1 - FBT_MAP < 2) {
      AsVector((Vector *)&keys,this);
      AppendToString<flexbuffers::Vector>
                (s,(Vector *)&keys,keys_quoted,indented,cur_indent + 1,indent_string,natural_utf8);
      return;
    }
    if ((TVar1 < FBT_MAX_TYPE) && ((0x100000f800U >> ((ulong)TVar1 & 0x3f) & 1) != 0)) {
      AsTypedVector(&keys,this);
      AppendToString<flexbuffers::TypedVector>
                (s,&keys,keys_quoted,indented,cur_indent + 1,indent_string,natural_utf8);
      return;
    }
    if (TVar1 - FBT_VECTOR_INT2 < 9) {
      AsFixedTypedVector((FixedTypedVector *)&keys,this);
      AppendToString<flexbuffers::FixedTypedVector>
                (s,(FixedTypedVector *)&keys,keys_quoted,indented,cur_indent + 1,indent_string,
                 natural_utf8);
      return;
    }
    if (TVar1 == FBT_BLOB) {
      AsBlob((Blob *)&keys,this);
      natural_utf8 = false;
      goto LAB_0013a1cd;
    }
    break;
  case FBT_BOOL:
    AsBool(this);
  }
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

void ToString(bool strings_quoted, bool keys_quoted, std::string &s,
                bool indented, int cur_indent, const char *indent_string,
                bool natural_utf8 = false) const {
    if (type_ == FBT_STRING) {
      String str(Indirect(), byte_width_);
      if (strings_quoted) {
        flatbuffers::EscapeString(str.c_str(), str.length(), &s, true, natural_utf8);
      } else {
        s.append(str.c_str(), str.length());
      }
    } else if (IsKey()) {
      auto str = AsKey();
      if (keys_quoted) {
        flatbuffers::EscapeString(str, strlen(str), &s, true, natural_utf8);
      } else {
        s += str;
      }
    } else if (IsInt()) {
      s += flatbuffers::NumToString(AsInt64());
    } else if (IsUInt()) {
      s += flatbuffers::NumToString(AsUInt64());
    } else if (IsFloat()) {
      s += flatbuffers::NumToString(AsDouble());
    } else if (IsNull()) {
      s += "null";
    } else if (IsBool()) {
      s += AsBool() ? "true" : "false";
    } else if (IsMap()) {
      s += "{";
      s += indented ? "\n" : " ";
      auto m = AsMap();
      auto keys = m.Keys();
      auto vals = m.Values();
      for (size_t i = 0; i < keys.size(); i++) {
        bool kq = keys_quoted;
        if (!kq) {
          // FlexBuffers keys may contain arbitrary characters, only allow
          // unquoted if it looks like an "identifier":
          const char *p = keys[i].AsKey();
          if (!flatbuffers::is_alpha(*p) && *p != '_') {
            kq = true;
          } else {
            while (*++p) {
              if (!flatbuffers::is_alnum(*p) && *p != '_') {
                kq = true;
                break;
              }
            }
          }
        }
        if (indented) IndentString(s, cur_indent + 1, indent_string);
        keys[i].ToString(true, kq, s);
        s += ": ";
        vals[i].ToString(true, keys_quoted, s, indented, cur_indent + 1, indent_string,
                         natural_utf8);
        if (i < keys.size() - 1) {
          s += ",";
          if (!indented) s += " ";
        }
        if (indented) s += "\n";
      }
      if (!indented) s += " ";
      if (indented) IndentString(s, cur_indent, indent_string);
      s += "}";
    } else if (IsVector()) {
      AppendToString<Vector>(s, AsVector(), keys_quoted, indented,
                             cur_indent + 1, indent_string, natural_utf8);
    } else if (IsTypedVector()) {
      AppendToString<TypedVector>(s, AsTypedVector(), keys_quoted, indented,
                                  cur_indent + 1, indent_string,
                                  natural_utf8);
    } else if (IsFixedTypedVector()) {
      AppendToString<FixedTypedVector>(s, AsFixedTypedVector(), keys_quoted,
                                       indented, cur_indent + 1, indent_string,
                                       natural_utf8);
    } else if (IsBlob()) {
      auto blob = AsBlob();
      flatbuffers::EscapeString(reinterpret_cast<const char *>(blob.data()),
                                blob.size(), &s, true, false);
    } else {
      s += "(?)";
    }
  }